

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsd_mbe.cpp
# Opt level: O0

void __thiscall DSDcc::DSDMBEDecoder::processAudio(DSDMBEDecoder *this)

{
  int iVar1;
  DSDMBEDecoder *in_RDI;
  int upsampling;
  float maxbuf;
  float gaindelta;
  float gainfactor;
  float max;
  float aout_abs;
  int n;
  int i;
  float in_stack_00000038;
  int in_stack_0000003c;
  DSDMBEDecoder *in_stack_00000040;
  float local_20;
  float local_1c;
  float local_18;
  int local_10;
  int local_c;
  
  if ((in_RDI->m_auto_gain & 1U) != 0) {
    local_18 = 0.0;
    in_RDI->m_audio_out_temp_buf_p = in_RDI->m_audio_out_temp_buf;
    for (local_10 = 0; local_10 < 0xa0; local_10 = local_10 + 1) {
      if (local_18 < ABS(*in_RDI->m_audio_out_temp_buf_p)) {
        local_18 = ABS(*in_RDI->m_audio_out_temp_buf_p);
      }
      in_RDI->m_audio_out_temp_buf_p = in_RDI->m_audio_out_temp_buf_p + 1;
    }
    *in_RDI->m_aout_max_buf_p = local_18;
    in_RDI->m_aout_max_buf_p = in_RDI->m_aout_max_buf_p + 1;
    in_RDI->m_aout_max_buf_idx = in_RDI->m_aout_max_buf_idx + 1;
    if (0x18 < in_RDI->m_aout_max_buf_idx) {
      in_RDI->m_aout_max_buf_idx = 0;
      in_RDI->m_aout_max_buf_p = in_RDI->m_aout_max_buf;
    }
    for (local_c = 0; local_c < 0x19; local_c = local_c + 1) {
      if (local_18 < in_RDI->m_aout_max_buf[local_c]) {
        local_18 = in_RDI->m_aout_max_buf[local_c];
      }
    }
    if (local_18 <= 0.0) {
      local_1c = 50.0;
    }
    else {
      local_1c = 30000.0 / local_18;
    }
    if (in_RDI->m_aout_gain <= local_1c) {
      if (50.0 < local_1c) {
        local_1c = 50.0;
      }
      local_20 = local_1c - in_RDI->m_aout_gain;
      if (in_RDI->m_aout_gain * 0.05 < local_20) {
        local_20 = in_RDI->m_aout_gain * 0.05;
      }
    }
    else {
      in_RDI->m_aout_gain = local_1c;
      local_20 = 0.0;
    }
    in_RDI->m_audio_out_temp_buf_p = in_RDI->m_audio_out_temp_buf;
    for (local_10 = 0; local_10 < 0xa0; local_10 = local_10 + 1) {
      *in_RDI->m_audio_out_temp_buf_p =
           (in_RDI->m_aout_gain + (float)local_10 * (local_20 / 160.0)) *
           *in_RDI->m_audio_out_temp_buf_p;
      in_RDI->m_audio_out_temp_buf_p = in_RDI->m_audio_out_temp_buf_p + 1;
    }
    in_RDI->m_aout_gain = (local_20 / 160.0) * 160.0 + in_RDI->m_aout_gain;
  }
  in_RDI->m_audio_out_temp_buf_p = in_RDI->m_audio_out_temp_buf;
  if (in_RDI->m_upsample < 2) {
    if (in_RDI->m_audio_out_buf_size <= in_RDI->m_audio_out_nb_samples + 0xa0) {
      resetAudio(in_RDI);
    }
    in_RDI->m_audio_out_float_buf_p = in_RDI->m_audio_out_float_buf;
    for (local_10 = 0; local_10 < 0xa0; local_10 = local_10 + 1) {
      if (*in_RDI->m_audio_out_temp_buf_p <= 32760.0) {
        if (*in_RDI->m_audio_out_temp_buf_p <= -32760.0 &&
            *in_RDI->m_audio_out_temp_buf_p != -32760.0) {
          *in_RDI->m_audio_out_temp_buf_p = -32760.0;
        }
      }
      else {
        *in_RDI->m_audio_out_temp_buf_p = 32760.0;
      }
      *in_RDI->m_audio_out_buf_p = (short)(int)*in_RDI->m_audio_out_temp_buf_p;
      in_RDI->m_audio_out_buf_p = in_RDI->m_audio_out_buf_p + 1;
      if ((in_RDI->m_stereo & 1U) != 0) {
        *in_RDI->m_audio_out_buf_p = (short)(int)*in_RDI->m_audio_out_temp_buf_p;
        in_RDI->m_audio_out_buf_p = in_RDI->m_audio_out_buf_p + 1;
      }
      in_RDI->m_audio_out_nb_samples = in_RDI->m_audio_out_nb_samples + 1;
      in_RDI->m_audio_out_temp_buf_p = in_RDI->m_audio_out_temp_buf_p + 1;
      in_RDI->m_audio_out_idx = in_RDI->m_audio_out_idx + 1;
      in_RDI->m_audio_out_idx2 = in_RDI->m_audio_out_idx2 + 1;
    }
  }
  else {
    iVar1 = in_RDI->m_upsample;
    if (in_RDI->m_audio_out_buf_size <= in_RDI->m_audio_out_nb_samples + iVar1 * 0xa0) {
      resetAudio(in_RDI);
    }
    in_RDI->m_audio_out_float_buf_p = in_RDI->m_audio_out_float_buf;
    for (local_10 = 0; local_10 < 0xa0; local_10 = local_10 + 1) {
      upsample(in_stack_00000040,in_stack_0000003c,in_stack_00000038);
      in_RDI->m_audio_out_temp_buf_p = in_RDI->m_audio_out_temp_buf_p + 1;
      in_RDI->m_audio_out_float_buf_p = in_RDI->m_audio_out_float_buf_p + iVar1;
      in_RDI->m_audio_out_idx = iVar1 + in_RDI->m_audio_out_idx;
      in_RDI->m_audio_out_idx2 = iVar1 + in_RDI->m_audio_out_idx2;
    }
    in_RDI->m_audio_out_float_buf_p = in_RDI->m_audio_out_float_buf;
    for (local_10 = 0; SBORROW4(local_10,iVar1 * 0xa0) != local_10 + iVar1 * -0xa0 < 0;
        local_10 = local_10 + 1) {
      if (*in_RDI->m_audio_out_float_buf_p <= 32760.0) {
        if (*in_RDI->m_audio_out_float_buf_p <= -32760.0 &&
            *in_RDI->m_audio_out_float_buf_p != -32760.0) {
          *in_RDI->m_audio_out_float_buf_p = -32760.0;
        }
      }
      else {
        *in_RDI->m_audio_out_float_buf_p = 32760.0;
      }
      if ((in_RDI->m_stereo & 1U) == 0) {
        *in_RDI->m_audio_out_buf_p = (short)(int)*in_RDI->m_audio_out_float_buf_p;
        in_RDI->m_audio_out_buf_p = in_RDI->m_audio_out_buf_p + 1;
      }
      else {
        if ((in_RDI->m_channels & 1) == 0) {
          *in_RDI->m_audio_out_buf_p = 0;
        }
        else {
          *in_RDI->m_audio_out_buf_p = (short)(int)*in_RDI->m_audio_out_float_buf_p;
        }
        in_RDI->m_audio_out_buf_p = in_RDI->m_audio_out_buf_p + 1;
        if (((int)(uint)in_RDI->m_channels >> 1 & 1U) == 0) {
          *in_RDI->m_audio_out_buf_p = 0;
        }
        else {
          *in_RDI->m_audio_out_buf_p = (short)(int)*in_RDI->m_audio_out_float_buf_p;
        }
        in_RDI->m_audio_out_buf_p = in_RDI->m_audio_out_buf_p + 1;
      }
      in_RDI->m_audio_out_nb_samples = in_RDI->m_audio_out_nb_samples + 1;
      in_RDI->m_audio_out_float_buf_p = in_RDI->m_audio_out_float_buf_p + 1;
    }
  }
  return;
}

Assistant:

void DSDMBEDecoder::processAudio()
{
    int i, n;
    float aout_abs, max, gainfactor, gaindelta, maxbuf;

    if (m_auto_gain)
    {
        // detect max level
        max = 0;
        m_audio_out_temp_buf_p = m_audio_out_temp_buf;

        for (n = 0; n < 160; n++)
        {
            aout_abs = fabsf(*m_audio_out_temp_buf_p);

            if (aout_abs > max)
            {
                max = aout_abs;
            }

            m_audio_out_temp_buf_p++;
        }

        *m_aout_max_buf_p = max;
        m_aout_max_buf_p++;
        m_aout_max_buf_idx++;

        if (m_aout_max_buf_idx > 24)
        {
            m_aout_max_buf_idx = 0;
            m_aout_max_buf_p = m_aout_max_buf;
        }

        // lookup max history
        for (i = 0; i < 25; i++)
        {
            maxbuf = m_aout_max_buf[i];

            if (maxbuf > max)
            {
                max = maxbuf;
            }
        }

        // determine optimal gain level
        if (max > (float) 0)
        {
            gainfactor = ((float) 30000 / max);
        }
        else
        {
            gainfactor = (float) 50;
        }

        if (gainfactor < m_aout_gain)
        {
            m_aout_gain = gainfactor;
            gaindelta = (float) 0;
        }
        else
        {
            if (gainfactor > (float) 50)
            {
                gainfactor = (float) 50;
            }

            gaindelta = gainfactor - m_aout_gain;

            if (gaindelta > ((float) 0.05 * m_aout_gain))
            {
                gaindelta = ((float) 0.05 * m_aout_gain);
            }
        }

        gaindelta /= (float) 160;

        // adjust output gain
        m_audio_out_temp_buf_p = m_audio_out_temp_buf;

        for (n = 0; n < 160; n++)
        {
            *m_audio_out_temp_buf_p = (m_aout_gain
                    + ((float) n * gaindelta)) * (*m_audio_out_temp_buf_p);
            m_audio_out_temp_buf_p++;
        }

        m_aout_gain += ((float) 160 * gaindelta);
    }
    else
    {
        gaindelta = (float) 0;
    }

    // copy audio data to output buffer and upsample if necessary
    m_audio_out_temp_buf_p = m_audio_out_temp_buf;

    //if ((m_upsample == 6) || (m_upsample == 7)) // upsampling to 48k
    if (m_upsample >= 2)
    {
        int upsampling = m_upsample;

        if (m_audio_out_nb_samples + (160*upsampling) >= m_audio_out_buf_size)
        {
            resetAudio();
        }

        m_audio_out_float_buf_p = m_audio_out_float_buf;

        for (n = 0; n < 160; n++)
        {
            upsample(upsampling, *m_audio_out_temp_buf_p);
            m_audio_out_temp_buf_p++;
            m_audio_out_float_buf_p += upsampling;
            m_audio_out_idx += upsampling;
            m_audio_out_idx2 += upsampling;
        }

        m_audio_out_float_buf_p = m_audio_out_float_buf;

        // copy to output (short) buffer
        for (n = 0; n < (160*upsampling); n++)
        {
            if (*m_audio_out_float_buf_p > (float) 32760)
            {
                *m_audio_out_float_buf_p = (float) 32760;
            }
            else if (*m_audio_out_float_buf_p < (float) -32760)
            {
                *m_audio_out_float_buf_p = (float) -32760;
            }


            if (m_stereo) // produce two channels
            {
            	if (m_channels & 1) { // left channel
                    *m_audio_out_buf_p = (short) *m_audio_out_float_buf_p;
            	} else {
            		*m_audio_out_buf_p = 0;
            	}

                m_audio_out_buf_p++;

                if ((m_channels>>1) & 1) { // right channel
                    *m_audio_out_buf_p = (short) *m_audio_out_float_buf_p;
            	} else {
            		*m_audio_out_buf_p = 0;
            	}

                m_audio_out_buf_p++;
            }
            else // single (mono) channel
            {
                *m_audio_out_buf_p = (short) *m_audio_out_float_buf_p;
                m_audio_out_buf_p++;
            }

            m_audio_out_nb_samples++;
            m_audio_out_float_buf_p++;
        }
    }
    else // leave at 8k
    {
        if (m_audio_out_nb_samples + 160 >= m_audio_out_buf_size)
        {
            resetAudio();
        }

        m_audio_out_float_buf_p = m_audio_out_float_buf;

        for (n = 0; n < 160; n++)
        {
            if (*m_audio_out_temp_buf_p > (float) 32760)
            {
                *m_audio_out_temp_buf_p = (float) 32760;
            }
            else if (*m_audio_out_temp_buf_p < (float) -32760)
            {
                *m_audio_out_temp_buf_p = (float) -32760;
            }

            *m_audio_out_buf_p = (short) *m_audio_out_temp_buf_p;
            m_audio_out_buf_p++;

            if (m_stereo) // produce second channel
            {
                *m_audio_out_buf_p = (short) *m_audio_out_temp_buf_p;
                m_audio_out_buf_p++;
            }

            m_audio_out_nb_samples++;
            m_audio_out_temp_buf_p++;
            m_audio_out_idx++;
            m_audio_out_idx2++;
        }
    }
}